

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

bool __thiscall Entity::logic(Entity *this,int step)

{
  Player *this_00;
  int in_ESI;
  ResourceManager *in_RDI;
  Player *p;
  ResourceManager *rm;
  int in_stack_ffffffffffffffcc;
  bool local_1;
  
  if (*(int *)&in_RDI[1].resources.super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
               _M_impl.super__Vector_impl_data._M_finish < 1) {
    (*(code *)(in_RDI->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
              _M_impl.super__Vector_impl_data._M_start[3])();
    ResourceManager::getInstance();
    this_00 = (Player *)ResourceManager::getData(in_RDI,in_stack_ffffffffffffffcc);
    Player::addScore(this_00,*(int *)((long)&in_RDI[1].resources.
                                             super__Vector_base<Resource_*,_std::allocator<Resource_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                    );
    local_1 = false;
  }
  else {
    if (0 < *(int *)&in_RDI[1].resources.super__Vector_base<Resource_*,_std::allocator<Resource_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      *(int *)&in_RDI[1].resources.super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage =
           *(int *)&in_RDI[1].resources.super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage - in_ESI;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Entity::logic(int step)
{
   if (hp <= 0) {
      spawn();
      ResourceManager& rm = ResourceManager::getInstance();
      Player *p = (Player *)rm.getData(RES_PLAYER);
      p->addScore(points);
      return false;
   }
   
   if (hilightCount > 0) {
      hilightCount -= step;
   }

   return true;
}